

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

array_container_t * array_container_create_range(uint32_t min,uint32_t max)

{
  int iVar1;
  array_container_t *paVar2;
  uint in_ESI;
  uint in_EDI;
  uint32_t k;
  array_container_t *answer;
  int32_t in_stack_ffffffffffffffdc;
  uint local_1c;
  
  paVar2 = array_container_create_given_capacity(in_stack_ffffffffffffffdc);
  if (paVar2 != (array_container_t *)0x0) {
    paVar2->cardinality = 0;
    for (local_1c = in_EDI; local_1c < in_ESI; local_1c = local_1c + 1) {
      iVar1 = paVar2->cardinality;
      paVar2->cardinality = iVar1 + 1;
      paVar2->array[iVar1] = (uint16_t)local_1c;
    }
  }
  return paVar2;
}

Assistant:

array_container_t *array_container_create_range(uint32_t min, uint32_t max) {
    array_container_t *answer =
        array_container_create_given_capacity(max - min + 1);
    if (answer == NULL) return answer;
    answer->cardinality = 0;
    for (uint32_t k = min; k < max; k++) {
        answer->array[answer->cardinality++] = k;
    }
    return answer;
}